

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::quantize_to_int8(Mat *src,Mat *dst,Mat *scale_data,Option *opt)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Layer *pLVar6;
  ParamDict pd;
  Mat local_98;
  ModelBinFromMatArray local_50;
  ParamDict local_40;
  
  pLVar6 = create_layer(0x39);
  ParamDict::ParamDict(&local_40);
  ParamDict::set(&local_40,0,scale_data->w);
  (*pLVar6->_vptr_Layer[2])(pLVar6,&local_40);
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  if (&local_98 != scale_data) {
    piVar1 = scale_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_98.data = scale_data->data;
    local_98.refcount._0_4_ = SUB84(scale_data->refcount,0);
    local_98.refcount._4_4_ = (undefined4)((ulong)scale_data->refcount >> 0x20);
    local_98.elemsize._0_4_ = (undefined4)scale_data->elemsize;
    local_98.elemsize._4_4_ = (undefined4)(scale_data->elemsize >> 0x20);
    local_98.elempack = scale_data->elempack;
    local_98.allocator = scale_data->allocator;
    uVar2 = scale_data->dims;
    uVar3 = scale_data->w;
    uVar4 = scale_data->h;
    uVar5 = scale_data->d;
    local_98.c = scale_data->c;
    local_98.cstep = scale_data->cstep;
    local_98.dims = uVar2;
    local_98.w = uVar3;
    local_98.h = uVar4;
    local_98.d = uVar5;
  }
  ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_98);
  (*pLVar6->_vptr_Layer[3])(pLVar6,&local_50);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
  (*pLVar6->_vptr_Layer[4])(pLVar6,opt);
  (*pLVar6->_vptr_Layer[7])(pLVar6,src,dst,opt);
  (*pLVar6->_vptr_Layer[5])(pLVar6,opt);
  (*pLVar6->_vptr_Layer[1])(pLVar6);
  piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  ParamDict::~ParamDict(&local_40);
  return;
}

Assistant:

void quantize_to_int8(const Mat& src, Mat& dst, const Mat& scale_data, const Option& opt)
{
    Layer* quantize = create_layer(LayerType::Quantize);

    ParamDict pd;
    pd.set(0, scale_data.w);

    quantize->load_param(pd);

    Mat weights[1];
    weights[0] = scale_data;

    quantize->load_model(ModelBinFromMatArray(weights));

    quantize->create_pipeline(opt);

    quantize->forward(src, dst, opt);

    quantize->destroy_pipeline(opt);

    delete quantize;
}